

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::number::impl::PropertiesAffixPatternProvider::getStringInternal
          (PropertiesAffixPatternProvider *this,int32_t flags)

{
  bool bVar1;
  bool bVar2;
  bool negative;
  bool prefix;
  int32_t flags_local;
  PropertiesAffixPatternProvider *this_local;
  
  bVar1 = (flags & 0x100U) == 0;
  bVar2 = (flags & 0x200U) == 0;
  if ((bVar1) || (bVar2)) {
    if (bVar1) {
      if (bVar2) {
        this_local = (PropertiesAffixPatternProvider *)&this->posSuffix;
      }
      else {
        this_local = (PropertiesAffixPatternProvider *)&this->negSuffix;
      }
    }
    else {
      this_local = (PropertiesAffixPatternProvider *)&this->posPrefix;
    }
  }
  else {
    this_local = (PropertiesAffixPatternProvider *)&this->negPrefix;
  }
  return (UnicodeString *)this_local;
}

Assistant:

const UnicodeString& PropertiesAffixPatternProvider::getStringInternal(int32_t flags) const {
    bool prefix = (flags & AFFIX_PREFIX) != 0;
    bool negative = (flags & AFFIX_NEGATIVE_SUBPATTERN) != 0;
    if (prefix && negative) {
        return negPrefix;
    } else if (prefix) {
        return posPrefix;
    } else if (negative) {
        return negSuffix;
    } else {
        return posSuffix;
    }
}